

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O1

Own<capnp::SchemaFile,_std::nullptr_t>
capnp::SchemaFile::newFromDirectory
          (ReadableDirectory *baseDir,Path *path,
          ArrayPtr<const_kj::ReadableDirectory_*const> importPath,
          Maybe<kj::String> *displayNameOverride)

{
  ReadableFile *pRVar1;
  DiskSchemaFile *pDVar2;
  DiskSchemaFile *extraout_RDX;
  Maybe<kj::String> *in_R9;
  Own<capnp::SchemaFile::DiskSchemaFile,_std::nullptr_t> OVar3;
  Own<capnp::SchemaFile,_std::nullptr_t> OVar4;
  PathPtr path_00;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_60;
  _func_int **local_50;
  _func_int **local_48;
  ArrayPtr<const_kj::ReadableDirectory_*const> local_40;
  
  local_40.ptr = (ReadableDirectory **)importPath.size_;
  path_00.parts.size_ = (size_t)(((Path *)importPath.ptr)->parts).ptr;
  path_00.parts.ptr = (String *)path;
  local_40.size_ = (size_t)displayNameOverride;
  kj::ReadableDirectory::openFile((ReadableDirectory *)&local_60,path_00);
  OVar3 = kj::
          heap<capnp::SchemaFile::DiskSchemaFile,kj::ReadableDirectory_const&,kj::Path,kj::ArrayPtr<kj::ReadableDirectory_const*const>&,kj::Own<kj::ReadableFile_const,decltype(nullptr)>,kj::Maybe<kj::String>>
                    ((kj *)&local_50,(ReadableDirectory *)path,(Path *)importPath.ptr,&local_40,
                     &local_60,in_R9);
  pRVar1 = local_60.ptr;
  pDVar2 = OVar3.ptr;
  (baseDir->super_FsNode)._vptr_FsNode = local_50;
  baseDir[1].super_FsNode._vptr_FsNode = local_48;
  local_48 = (_func_int **)0x0;
  if (local_60.ptr != (ReadableFile *)0x0) {
    local_60.ptr = (ReadableFile *)0x0;
    (**(local_60.disposer)->_vptr_Disposer)
              (local_60.disposer,
               (pRVar1->super_FsNode)._vptr_FsNode[-2] + (long)&(pRVar1->super_FsNode)._vptr_FsNode)
    ;
    pDVar2 = extraout_RDX;
  }
  OVar4.ptr = &pDVar2->super_SchemaFile;
  OVar4.disposer = (Disposer *)baseDir;
  return OVar4;
}

Assistant:

kj::Own<SchemaFile> SchemaFile::newFromDirectory(
    const kj::ReadableDirectory& baseDir, kj::Path path,
    kj::ArrayPtr<const kj::ReadableDirectory* const> importPath,
    kj::Maybe<kj::String> displayNameOverride) {
  return kj::heap<DiskSchemaFile>(baseDir, kj::mv(path), importPath, baseDir.openFile(path),
                                  kj::mv(displayNameOverride));
}